

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O0

string * __thiscall
smf::MidiFile::base64Decode(string *__return_storage_ptr__,MidiFile *this,string *input)

{
  byte bVar1;
  int iVar2;
  bool bVar3;
  byte *pbVar4;
  const_reference pvVar5;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_48;
  uchar c;
  const_iterator __end1;
  const_iterator __begin1;
  string *__range1;
  int valb;
  int vala;
  string *input_local;
  MidiFile *this_local;
  string *output;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  __range1._4_4_ = -8;
  __end1._M_current = (char *)std::__cxx11::string::begin();
  _Stack_48._M_current = (char *)std::__cxx11::string::end();
  while( true ) {
    bVar3 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffffb8);
    if (!bVar3) {
      return __return_storage_ptr__;
    }
    pbVar4 = (byte *)__gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&__end1);
    bVar1 = *pbVar4;
    if (bVar1 == 0x3d) break;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)decodeLookup,(ulong)bVar1);
    iVar2 = __range1._4_4_;
    if (*pvVar5 != -1) {
      std::vector<int,_std::allocator<int>_>::operator[]
                ((vector<int,_std::allocator<int>_> *)decodeLookup,(ulong)bVar1);
      iVar2 = __range1._4_4_ + 6;
      if (-1 < __range1._4_4_ + 6) {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
        iVar2 = __range1._4_4_ + -2;
      }
    }
    __range1._4_4_ = iVar2;
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string MidiFile::base64Decode(const std::string& input) {
	// vector<int> decodeLookup(256,-1);
	// for (int i=0; i<64; i++) decodeLookup[encodeLookup[i]] = i;

	std::string output;
	int vala = 0;
	int valb = -8;
	for (uchar c : input) {
		if (c == '=') {
			break;
		} else if (MidiFile::decodeLookup[c] == -1) {
         // Ignore whitespace, for example.
			continue;
		}
		vala = (vala << 6) + MidiFile::decodeLookup[c];
		valb += 6;
		if (valb >= 0) {
			output.push_back(char((vala >> valb) & 0xFF));
			valb -= 8;
		}
	}
	return output;
}